

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rand.cpp
# Opt level: O3

void __thiscall crnlib::ranctx::seed(ranctx *this,uint32 seed)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint32 uVar5;
  uint32 uVar6;
  int iVar7;
  
  iVar4 = 0x14;
  uVar5 = seed;
  uVar6 = seed;
  uVar2 = 0xf1ea5eed;
  do {
    uVar1 = uVar5 + seed;
    uVar3 = (seed << 0x11 | seed >> 0xf) ^ uVar6;
    iVar7 = uVar2 - (uVar6 << 0x1b | uVar6 >> 5);
    seed = uVar5 + iVar7;
    uVar5 = iVar7 + uVar3;
    iVar4 = iVar4 + -1;
    uVar6 = uVar1;
    uVar2 = uVar3;
  } while (iVar4 != 0);
  this->a = uVar3;
  this->b = uVar1;
  this->c = seed;
  this->d = uVar5;
  return;
}

Assistant:

void ranctx::seed(uint32 seed) {
  a = 0xf1ea5eed, b = c = d = seed;
  for (uint32 i = 0; i < 20; ++i)
    next();
}